

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

Vec_Int_t * Gia_ManGetTestPatterns(char *pFileName)

{
  uint uVar1;
  Vec_Int_t *pVStack_28;
  int c;
  Vec_Int_t *vTests;
  FILE *pFile;
  char *pFileName_local;
  
  pFile = (FILE *)pFileName;
  vTests = (Vec_Int_t *)fopen(pFileName,"rb");
  if ((FILE *)vTests == (FILE *)0x0) {
    printf("Cannot open input file \"%s\".\n",pFile);
    pFileName_local = (char *)0x0;
  }
  else {
    pVStack_28 = Vec_IntAlloc(10000);
    while (uVar1 = fgetc((FILE *)vTests), uVar1 != 0xffffffff) {
      if ((((uVar1 != 0x20) && (uVar1 != 9)) && (uVar1 != 0xd)) && (uVar1 != 10)) {
        if ((uVar1 != 0x30) && (uVar1 != 0x31)) {
          printf("Wring symbol (%c) in the input file.\n",(ulong)uVar1);
          Vec_IntFreeP(&stack0xffffffffffffffd8);
          break;
        }
        Vec_IntPush(pVStack_28,uVar1 - 0x30);
      }
    }
    fclose((FILE *)vTests);
    pFileName_local = (char *)pVStack_28;
  }
  return (Vec_Int_t *)pFileName_local;
}

Assistant:

Vec_Int_t * Gia_ManGetTestPatterns( char * pFileName )
{
    FILE * pFile = fopen( pFileName, "rb" );
    Vec_Int_t * vTests; int c;
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\".\n", pFileName );
        return NULL;
    }
    vTests = Vec_IntAlloc( 10000 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == ' ' || c == '\t' || c == '\r' || c == '\n' )
            continue;
        if ( c != '0' && c != '1' )
        {
            printf( "Wring symbol (%c) in the input file.\n", c );
            Vec_IntFreeP( &vTests );
            break;
        }
        Vec_IntPush( vTests, c - '0' );
    }
    fclose( pFile );
    return vTests;
}